

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if2.c
# Opt level: O0

void tc(int pi)

{
  undefined4 uVar1;
  int iVar2;
  undefined4 in_EDI;
  char buf [128];
  int e;
  int b;
  int x;
  int h;
  char in_stack_ffffffffffffff68;
  char in_stack_ffffffffffffff69;
  char in_stack_ffffffffffffff6a;
  undefined5 in_stack_ffffffffffffff6b;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int local_c;
  
  printf("SPI tests.");
  uVar1 = spi_open(in_EDI,1,50000,0);
  CHECK(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
        in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
        (char *)CONCAT53(in_stack_ffffffffffffff6b,
                         CONCAT12(in_stack_ffffffffffffff6a,
                                  CONCAT11(in_stack_ffffffffffffff69,in_stack_ffffffffffffff68))));
  for (local_c = 0; local_c < 5; local_c = local_c + 1) {
    sprintf(&stack0xffffffffffffff68,anon_var_dwarf_699);
    iVar2 = spi_xfer(in_EDI,uVar1,&stack0xffffffffffffff68,&stack0xffffffffffffff68,3);
    CHECK(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
          in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
          (char *)CONCAT53(in_stack_ffffffffffffff6b,
                           CONCAT12(in_stack_ffffffffffffff6a,
                                    CONCAT11(in_stack_ffffffffffffff69,in_stack_ffffffffffffff68))))
    ;
    if (iVar2 == 3) {
      time_sleep(0x3ff0000000000000);
      printf("%d ",(ulong)(((int)in_stack_ffffffffffffff69 & 0xfU) << 8 |
                          (int)in_stack_ffffffffffffff6a));
    }
  }
  spi_close(in_EDI,uVar1);
  CHECK(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
        in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
        (char *)CONCAT53(in_stack_ffffffffffffff6b,
                         CONCAT12(in_stack_ffffffffffffff6a,
                                  CONCAT11(in_stack_ffffffffffffff69,in_stack_ffffffffffffff68))));
  return;
}

Assistant:

void tc(int pi)
{
   int h, x, b, e;
   char buf[128];

   printf("SPI tests.");

   /* this test requires a MCP3202 on SPI channel 1 */

   h = spi_open(pi, 1, 50000, 0);
   CHECK(12, 1, h, 0, 0, "spi open");


   for (x=0; x<5; x++)
   {
      sprintf(buf, "\x01\x80");
      b = spi_xfer(pi, h, buf, buf, 3);
      CHECK(12, 2, b, 3, 0, "spi xfer");
      if (b == 3)
      {
         time_sleep(1.0);
         printf("%d ", ((buf[1]&0x0F)*256)|buf[2]);
      }
   }

   e = spi_close(pi, h);
   CHECK(12, 99, e, 0, 0, "spi close");
}